

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCCof.c
# Opt level: O2

Gia_Man_t * Gia_ManCofTest(Gia_Man_t *pGia,int nFrameMax,int nConfMax,int nTimeMax,int fVerbose)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  abctime aVar5;
  Ccf_Man_t *p;
  Gia_Man_t *pGVar6;
  Gia_Obj_t *pGVar7;
  Gia_Man_t *pGVar8;
  abctime time;
  int i;
  char *pcVar9;
  uint fMax;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  
  aVar4 = Abc_Clock();
  aVar5 = Abc_Clock();
  if (pGia->vCos->nSize - pGia->nRegs != 1) {
    __assert_fail("Gia_ManPoNum(pGia) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCCof.c"
                  ,0x112,"Gia_Man_t *Gia_ManCofTest(Gia_Man_t *, int, int, int, int)");
  }
  lVar10 = aVar4 + (long)nTimeMax * 1000000;
  p = Ccf_ManStart(pGia,nFrameMax,nConfMax,nTimeMax,fVerbose);
  if (nTimeMax != 0) {
    p->pSat->nRuntimeLimit = lVar10;
  }
  uVar12 = 0;
  if (0 < nFrameMax) {
    uVar12 = nFrameMax;
  }
  bVar1 = false;
  fMax = 0;
  iVar2 = -1;
  do {
    iVar3 = iVar2;
    if (fMax == uVar12) {
      uVar11 = (ulong)uVar12;
      break;
    }
    uVar11 = (ulong)fMax;
    if (fVerbose != 0) {
      printf("ITER %3d :\n",uVar11);
    }
    fMax = fMax + 1;
    pGVar6 = (Gia_Man_t *)Gia_ManUnrollAdd(p->pUnr,fMax);
    p->pFrames = pGVar6;
    Gia_ManCofExtendSolver(p);
    iVar2 = Gia_ManUnrollLastLit(p->pUnr);
    iVar3 = Gia_ManCofGetReachable(p,iVar2);
    if (iVar3 != 0) break;
    Gia_ManSetPhase(p->pFrames);
    i = 0;
    while( true ) {
      pGVar6 = p->pFrames;
      if (pGVar6->vCos->nSize - pGVar6->nRegs <= i) break;
      iVar2 = Vec_IntEntry(pGVar6->vCos,i);
      pGVar7 = Gia_ManObj(pGVar6,iVar2);
      if (pGVar7 == (Gia_Obj_t *)0x0) break;
      if (*(long *)pGVar7 < 0) {
        printf("Property failed in frame %d.\n",uVar11);
        bVar1 = true;
        break;
      }
      i = i + 1;
    }
    iVar3 = 0;
    iVar2 = 0;
  } while (p->pFrames->vCos->nSize - p->pFrames->nRegs <= i);
  if ((lVar10 == 0) || (aVar4 = Abc_Clock(), aVar4 <= lVar10)) {
    if ((int)uVar11 == nFrameMax) {
      pcVar9 = "Completed %d frames without converging.  ";
    }
    else {
      if (iVar3 == -1) {
        pcVar9 = "Conflict limit or timeout is reached after %d frames.  ";
      }
      else {
        if (iVar3 != 1) goto LAB_005ae8d1;
        pcVar9 = "Backward reachability converged after %d iterations.  ";
      }
      nFrameMax = (int)uVar11 - 1;
    }
    printf(pcVar9,(ulong)(uint)nFrameMax);
  }
  else {
    printf("Runtime limit (%d sec) is reached after %d frames.  ",(ulong)(uint)nTimeMax,uVar11);
  }
LAB_005ae8d1:
  aVar4 = Abc_Clock();
  Abc_PrintTime(0x7ac161,(char *)(aVar4 - aVar5),time);
  if (!bVar1) {
    pcVar9 = "Property is undecided.";
    if (iVar3 == 1) {
      pcVar9 = "Property holds.";
    }
    puts(pcVar9);
  }
  Gia_ManHashStop(p->pFrames);
  pGVar6 = p->pFrames;
  p->pFrames = (Gia_Man_t *)0x0;
  Ccf_ManStop(p);
  pGVar8 = Gia_ManCleanup(pGVar6);
  Gia_ManStop(pGVar6);
  return pGVar8;
}

Assistant:

Gia_Man_t * Gia_ManCofTest( Gia_Man_t * pGia, int nFrameMax, int nConfMax, int nTimeMax, int fVerbose )
{ 
    Gia_Man_t * pNew;
    Ccf_Man_t * p;
    Gia_Obj_t * pObj;
    int f, i, Lit, RetValue = -1, fFailed = 0;
    abctime nTimeToStop = Abc_Clock() + nTimeMax * CLOCKS_PER_SEC;
    abctime clk = Abc_Clock();
    assert( Gia_ManPoNum(pGia) == 1 );

    // create reachability manager
    p = Ccf_ManStart( pGia, nFrameMax, nConfMax, nTimeMax, fVerbose );

    // set runtime limit
    if ( nTimeMax )
        sat_solver_set_runtime_limit( p->pSat, nTimeToStop );

    // perform backward image computation
    for ( f = 0; f < nFrameMax; f++ )
    {
        if ( fVerbose ) 
            printf( "ITER %3d :\n", f );
        // add to the mapping of nodes
        p->pFrames = (Gia_Man_t *)Gia_ManUnrollAdd( p->pUnr, f+1 );
        // add SAT clauses
        Gia_ManCofExtendSolver( p );
        // return output literal
        Lit = Gia_ManUnrollLastLit( p->pUnr );
        // derives cofactors of the property literal till all states are blocked
        RetValue = Gia_ManCofGetReachable( p, Lit );
        if ( RetValue )
            break;

        // check the property output
        Gia_ManSetPhase( p->pFrames );
        Gia_ManForEachPo( p->pFrames, pObj, i )
            if ( pObj->fPhase )
            {
                printf( "Property failed in frame %d.\n", f );
                fFailed = 1;
                break;
            }
        if ( i < Gia_ManPoNum(p->pFrames) )
            break;
    }

    // report the result
    if ( nTimeToStop && Abc_Clock() > nTimeToStop )
        printf( "Runtime limit (%d sec) is reached after %d frames.  ", nTimeMax, f );
    else if ( f == nFrameMax )
        printf( "Completed %d frames without converging.  ", f );
    else if ( RetValue == 1 )
        printf( "Backward reachability converged after %d iterations.  ", f-1 );
    else if ( RetValue == -1 )
        printf( "Conflict limit or timeout is reached after %d frames.  ", f-1 );
    Abc_PrintTime( 1, "Runtime", Abc_Clock() - clk );

    if ( !fFailed && RetValue == 1 )
        printf( "Property holds.\n" );
    else if ( !fFailed )
        printf( "Property is undecided.\n" );

    // get the resulting AIG manager
    Gia_ManHashStop( p->pFrames );
    pNew = p->pFrames;  p->pFrames = NULL;
    Ccf_ManStop( p );

    // cleanup
//    if ( fVerbose )
//        Gia_ManPrintStats( pNew, 0 );
    pNew = Gia_ManCleanup( pGia = pNew );
    Gia_ManStop( pGia );
//    if ( fVerbose )
//        Gia_ManPrintStats( pNew, 0 );
    return pNew;   
}